

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawVert *vert_start,ImDrawVert *vert_end,ImVec2 gradient_p0,ImVec2 gradient_p1,
               ImU32 col0,ImU32 col1)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (vert_start < vert_end) {
    fVar3 = gradient_p1.x - gradient_p0.x;
    fVar4 = gradient_p1.y - gradient_p0.y;
    uVar2 = col0 >> 8 & 0xff;
    uVar1 = col0 >> 0x10 & 0xff;
    do {
      fVar5 = (((vert_start->pos).x - gradient_p0.x) * fVar3 +
              ((vert_start->pos).y - gradient_p0.y) * fVar4) *
              (1.0 / (fVar3 * fVar3 + fVar4 * fVar4));
      fVar6 = 1.0;
      if (fVar5 <= 1.0) {
        fVar6 = fVar5;
      }
      fVar6 = (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar6);
      vert_start->col =
           (uint)*(byte *)((long)&vert_start->col + 3) << 0x18 |
           (int)((float)(int)((col1 & 0xff) - (col0 & 0xff)) * fVar6 + (float)(col0 & 0xff)) |
           (int)((float)(int)((col1 >> 8 & 0xff) - uVar2) * fVar6 + (float)uVar2) << 8 |
           (int)(fVar6 * (float)(int)((col1 >> 0x10 & 0xff) - uVar1) + (float)uVar1) << 0x10;
      vert_start = vert_start + 1;
    } while (vert_start < vert_end);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawVert* vert_start, ImDrawVert* vert_end, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = ImLerp((int)(col0 >> IM_COL32_R_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_R_SHIFT) & 0xFF, t);
        int g = ImLerp((int)(col0 >> IM_COL32_G_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_G_SHIFT) & 0xFF, t);
        int b = ImLerp((int)(col0 >> IM_COL32_B_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_B_SHIFT) & 0xFF, t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}